

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall FNodeBuilder::AddSegToBBox(FNodeBuilder *this,fixed_t *bbox,FPrivSeg *seg)

{
  FPrivVert *pFVar1;
  FPrivVert *pFVar2;
  FPrivVert *v2;
  FPrivVert *v1;
  FPrivSeg *seg_local;
  fixed_t *bbox_local;
  FNodeBuilder *this_local;
  
  pFVar1 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)seg->v1);
  pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)seg->v2);
  if ((pFVar1->super_FSimpleVert).x < bbox[2]) {
    bbox[2] = (pFVar1->super_FSimpleVert).x;
  }
  if (bbox[3] < (pFVar1->super_FSimpleVert).x) {
    bbox[3] = (pFVar1->super_FSimpleVert).x;
  }
  if ((pFVar1->super_FSimpleVert).y < bbox[1]) {
    bbox[1] = (pFVar1->super_FSimpleVert).y;
  }
  if (*bbox < (pFVar1->super_FSimpleVert).y) {
    *bbox = (pFVar1->super_FSimpleVert).y;
  }
  if ((pFVar2->super_FSimpleVert).x < bbox[2]) {
    bbox[2] = (pFVar2->super_FSimpleVert).x;
  }
  if (bbox[3] < (pFVar2->super_FSimpleVert).x) {
    bbox[3] = (pFVar2->super_FSimpleVert).x;
  }
  if ((pFVar2->super_FSimpleVert).y < bbox[1]) {
    bbox[1] = (pFVar2->super_FSimpleVert).y;
  }
  if (*bbox < (pFVar2->super_FSimpleVert).y) {
    *bbox = (pFVar2->super_FSimpleVert).y;
  }
  return;
}

Assistant:

void FNodeBuilder::AddSegToBBox (fixed_t bbox[4], const FPrivSeg *seg)
{
	FPrivVert *v1 = &Vertices[seg->v1];
	FPrivVert *v2 = &Vertices[seg->v2];

	if (v1->x < bbox[BOXLEFT])		bbox[BOXLEFT] = v1->x;
	if (v1->x > bbox[BOXRIGHT])		bbox[BOXRIGHT] = v1->x;
	if (v1->y < bbox[BOXBOTTOM])	bbox[BOXBOTTOM] = v1->y;
	if (v1->y > bbox[BOXTOP])		bbox[BOXTOP] = v1->y;

	if (v2->x < bbox[BOXLEFT])		bbox[BOXLEFT] = v2->x;
	if (v2->x > bbox[BOXRIGHT])		bbox[BOXRIGHT] = v2->x;
	if (v2->y < bbox[BOXBOTTOM])	bbox[BOXBOTTOM] = v2->y;
	if (v2->y > bbox[BOXTOP])		bbox[BOXTOP] = v2->y;
}